

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O1

void wallet::WalletDescriptor::
     SerializationOps<DataStream,wallet::WalletDescriptor,ActionUnserialize>
               (WalletDescriptor *obj,DataStream *s)

{
  long in_FS_OFFSET;
  string descriptor_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ActionUnserialize::
  SerReadWriteMany<DataStream,std::__cxx11::string&,unsigned_long&,int&,int&,int&>
            (s,&local_38,&obj->creation_time,&obj->next_index,&obj->range_start,&obj->range_end);
  DeserializeDescriptor(obj,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(WalletDescriptor, obj)
    {
        std::string descriptor_str;
        SER_WRITE(obj, descriptor_str = obj.descriptor->ToString());
        READWRITE(descriptor_str, obj.creation_time, obj.next_index, obj.range_start, obj.range_end);
        SER_READ(obj, obj.DeserializeDescriptor(descriptor_str));
    }